

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O0

void __thiscall CBroadcast::CBroadcast(CBroadcast *this)

{
  CComponent *in_RDI;
  CTextCursor *this_00;
  
  CComponent::CComponent(in_RDI);
  in_RDI->_vptr_CComponent = (_func_int **)&PTR__CBroadcast_00298518;
  this_00 = (CTextCursor *)(in_RDI + 1);
  CTextCursor::CTextCursor(this_00);
  CTextCursor::CTextCursor(this_00);
  (*in_RDI->_vptr_CComponent[7])();
  return;
}

Assistant:

CBroadcast::CBroadcast()
{
	OnReset();
}